

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# words.c
# Opt level: O3

void update_error_limit(words_data *w,uint32_t flags)

{
  uint32_t uVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar4 = w->bitrate_acc[0] + w->bitrate_delta[0];
  w->bitrate_acc[0] = uVar4;
  uVar4 = uVar4 >> 0x10;
  if ((flags & 0x40000004) == 0) {
    uVar6 = w->bitrate_acc[1] + w->bitrate_delta[1];
    w->bitrate_acc[1] = uVar6;
    uVar6 = uVar6 >> 0x10;
    if ((flags >> 9 & 1) == 0) {
      uVar1 = exp2s(uVar4);
      w->c[0].error_limit = uVar1;
      lVar5 = 0x48;
      uVar4 = uVar6;
    }
    else {
      uVar3 = w->c[0].slow_level + 0x80 >> 8;
      uVar8 = w->c[1].slow_level + 0x80 >> 8;
      if ((flags >> 10 & 1) != 0) {
        iVar7 = (int)((uVar6 - uVar3) + uVar8 + 1) >> 1;
        if ((int)uVar4 < iVar7) {
          uVar6 = uVar4 * 2;
          uVar4 = 0;
        }
        else if (SBORROW4(uVar4,-iVar7) == (int)(uVar4 + iVar7) < 0) {
          uVar6 = iVar7 + uVar4;
          uVar4 = uVar4 - iVar7;
        }
        else {
          uVar4 = uVar4 * 2;
          uVar6 = 0;
        }
      }
      iVar7 = uVar3 - uVar4;
      iVar2 = 0;
      uVar1 = 0;
      if (-0x100 < iVar7) {
        uVar1 = exp2s(iVar7 + 0x100);
      }
      w->c[0].error_limit = uVar1;
      iVar7 = uVar8 - uVar6;
      lVar5 = 0x48;
      if (iVar7 < -0xff) goto LAB_001b1306;
      uVar4 = iVar7 + 0x100;
    }
  }
  else {
    lVar5 = 0x34;
    if ((flags >> 9 & 1) != 0) {
      iVar7 = (w->c[0].slow_level + 0x80 >> 8) - uVar4;
      if (iVar7 < -0xff) {
        iVar2 = 0;
        goto LAB_001b1306;
      }
      uVar4 = iVar7 + 0x100;
    }
  }
  iVar2 = exp2s(uVar4);
LAB_001b1306:
  *(int32_t *)((long)w->bitrate_delta + lVar5) = iVar2;
  return;
}

Assistant:

void update_error_limit (struct words_data *w, uint32_t flags)
{
    int bitrate_0 = (w->bitrate_acc [0] += w->bitrate_delta [0]) >> 16;

    if (flags & MONO_DATA) {
        if (flags & HYBRID_BITRATE) {
            int slow_log_0 = (w->c [0].slow_level + SLO) >> SLS;

            if (slow_log_0 - bitrate_0 > -0x100)
                w->c [0].error_limit = exp2s (slow_log_0 - bitrate_0 + 0x100);
            else
                w->c [0].error_limit = 0;
        }
        else
            w->c [0].error_limit = exp2s (bitrate_0);
    }
    else {
        int bitrate_1 = (w->bitrate_acc [1] += w->bitrate_delta [1]) >> 16;

        if (flags & HYBRID_BITRATE) {
            int slow_log_0 = (w->c [0].slow_level + SLO) >> SLS;
            int slow_log_1 = (w->c [1].slow_level + SLO) >> SLS;

            if (flags & HYBRID_BALANCE) {
                int balance = (slow_log_1 - slow_log_0 + bitrate_1 + 1) >> 1;

                if (balance > bitrate_0) {
                    bitrate_1 = bitrate_0 * 2;
                    bitrate_0 = 0;
                }
                else if (-balance > bitrate_0) {
                    bitrate_0 = bitrate_0 * 2;
                    bitrate_1 = 0;
                }
                else {
                    bitrate_1 = bitrate_0 + balance;
                    bitrate_0 = bitrate_0 - balance;
                }
            }

            if (slow_log_0 - bitrate_0 > -0x100)
                w->c [0].error_limit = exp2s (slow_log_0 - bitrate_0 + 0x100);
            else
                w->c [0].error_limit = 0;

            if (slow_log_1 - bitrate_1 > -0x100)
                w->c [1].error_limit = exp2s (slow_log_1 - bitrate_1 + 0x100);
            else
                w->c [1].error_limit = 0;
        }
        else {
            w->c [0].error_limit = exp2s (bitrate_0);
            w->c [1].error_limit = exp2s (bitrate_1);
        }
    }
}